

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

char * find_substr(char *str,char *s)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  uint len;
  char *s_local;
  char *str_local;
  
  sVar2 = strlen(s);
  s_local = str;
  if ((int)sVar2 == 1) {
    while( true ) {
      bVar3 = false;
      if (*s_local != '\0') {
        bVar3 = *s_local != *s;
      }
      if (!bVar3) break;
      s_local = s_local + 1;
    }
    if (*s_local == *s) {
      return s_local + 1;
    }
  }
  else {
    for (; *s_local != '\0'; s_local = s_local + 1) {
      iVar1 = strncmp(s,s_local,sVar2 & 0xffffffff);
      if (iVar1 == 0) {
        return s_local + (sVar2 & 0xffffffff);
      }
    }
  }
  return (char *)0x0;
}

Assistant:

static const char *find_substr(const char *str, const char *s) {
  uint len = strlen(s);
  if (len == 1) {
    while (*str && *str != *s) str++;
    if (*str == *s) return str + 1;
  } else
    while (*str) {
      if (!strncmp(s, str, len)) return str + len;
      str++;
    }
  return NULL;
}